

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_thread_test.cc
# Opt level: O1

int main(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  uint __len;
  thread __s1;
  char cVar6;
  char cVar7;
  RetCode RVar8;
  int iVar9;
  undefined8 *puVar10;
  native_handle_type *pnVar11;
  size_t sVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  int i;
  long lVar16;
  long lVar17;
  long lVar18;
  int i_1;
  long lVar19;
  long *in_FS_OFFSET;
  string value;
  thread ths [4];
  string engine_path;
  thread local_128;
  size_t local_120;
  ulong local_118;
  native_handle_type nStack_110;
  ulong *local_108;
  long lStack_100;
  ulong uStack_f8;
  undefined8 uStack_f0;
  long local_e8;
  thread local_e0;
  size_type sStack_d8;
  ulong local_d0;
  native_handle_type nStack_c8;
  string local_c0;
  string *local_a0;
  ulong local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  char *local_50 [2];
  char local_40 [16];
  
  paVar2 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "======================= multi thread test ============================","");
  printf("\x1b[1;32;40m%s\x1b[0m\n",local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_108 = &uStack_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"./data/test-","");
  uVar13 = rdtsc();
  cVar7 = '\x01';
  if (9 < uVar13) {
    uVar15 = uVar13;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar15 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001039a0;
      }
      if (uVar15 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001039a0;
      }
      if (uVar15 < 10000) goto LAB_001039a0;
      bVar4 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar4);
    cVar7 = cVar7 + '\x01';
  }
LAB_001039a0:
  local_128._M_id._M_thread = (id)&local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)local_128._M_id._M_thread,(uint)local_120,uVar13);
  uVar13 = 0xf;
  if (local_108 != &uStack_f8) {
    uVar13 = uStack_f8;
  }
  if (uVar13 < local_120 + lStack_100) {
    uVar13 = 0xf;
    if (local_128._M_id._M_thread != (id)&local_118) {
      uVar13 = local_118;
    }
    if (local_120 + lStack_100 <= uVar13) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_108);
      goto LAB_00103a22;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128._M_id._M_thread);
LAB_00103a22:
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0.field_2._8_8_ = puVar10[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_c0._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_128._M_id._M_thread != (id)&local_118) {
    operator_delete((void *)local_128._M_id._M_thread);
  }
  if (local_108 != &uStack_f8) {
    operator_delete(local_108);
  }
  RVar8 = polar_race::Engine::Open(&local_c0,&engine);
  if (RVar8 != kSucc) {
    __assert_fail("ret == kSucc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                  ,0x38,"int main()");
  }
  lVar16 = 0;
  printf("open engine_path: %s\n",local_c0._M_dataplus._M_p);
  lVar17 = *in_FS_OFFSET;
  local_a0 = vs_abi_cxx11_[0];
  do {
    uVar13 = 0;
    local_e8 = lVar16;
    do {
      lVar16 = 0;
      local_98 = uVar13;
      do {
        if (*(char *)((long)in_FS_OFFSET + -4) == '\0') {
          *(undefined1 *)((long)in_FS_OFFSET + -4) = 1;
          uVar5 = rdtsc();
          *(int *)(in_FS_OFFSET + -1) = (int)uVar5;
        }
        iVar9 = rand_r((uint *)(lVar17 + -8));
        k[lVar16] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                    [(ulong)(long)iVar9 % 0x3e];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      k[6] = '\0';
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],1,(uint)local_e8);
      pnVar11 = (native_handle_type *)std::__cxx11::string::append((char *)local_50);
      local_e0._M_id._M_thread = (id)&local_d0;
      puVar14 = pnVar11 + 2;
      if ((ulong *)*pnVar11 == puVar14) {
        local_d0 = *puVar14;
        nStack_c8 = pnVar11[3];
      }
      else {
        local_d0 = *puVar14;
        local_e0._M_id._M_thread = (id)(id)*pnVar11;
      }
      sStack_d8 = pnVar11[1];
      *pnVar11 = (native_handle_type)puVar14;
      pnVar11[1] = 0;
      *(undefined1 *)(pnVar11 + 2) = 0;
      local_70 = local_60;
      sVar12 = strlen(k);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,k,k + sVar12);
      uVar13 = local_98;
      uVar15 = 0xf;
      if (local_e0._M_id._M_thread != (id)&local_d0) {
        uVar15 = local_d0;
      }
      if (uVar15 < local_68 + sStack_d8) {
        uVar15 = 0xf;
        if (local_70 != local_60) {
          uVar15 = local_60[0];
        }
        if (uVar15 < local_68 + sStack_d8) goto LAB_00103c95;
        pnVar11 = (native_handle_type *)
                  std::__cxx11::string::replace
                            ((ulong)&local_70,0,(char *)0x0,(ulong)local_e0._M_id._M_thread);
      }
      else {
LAB_00103c95:
        pnVar11 = (native_handle_type *)
                  std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_70);
      }
      local_128._M_id._M_thread = (id)&local_118;
      puVar14 = pnVar11 + 2;
      if ((ulong *)*pnVar11 == puVar14) {
        local_118 = *puVar14;
        nStack_110 = pnVar11[3];
      }
      else {
        local_118 = *puVar14;
        local_128._M_id._M_thread = (id)(id)*pnVar11;
      }
      local_120 = pnVar11[1];
      *pnVar11 = (native_handle_type)puVar14;
      pnVar11[1] = 0;
      *(undefined1 *)puVar14 = 0;
      __len = 3 - (uVar13 < 100);
      if (uVar13 < 10) {
        __len = 1;
      }
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,__len,(uint)uVar13);
      uVar13 = 0xf;
      if (local_128._M_id._M_thread != (id)&local_118) {
        uVar13 = local_118;
      }
      if (uVar13 < local_88 + local_120) {
        uVar13 = 0xf;
        if (local_90 != local_80) {
          uVar13 = local_80[0];
        }
        if (uVar13 < local_88 + local_120) goto LAB_00103dab;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_90,0,(char *)0x0,(ulong)local_128._M_id._M_thread);
      }
      else {
LAB_00103dab:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_90);
      }
      uVar13 = local_98;
      lVar16 = local_e8;
      puVar14 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar14) {
        uStack_f8 = *puVar14;
        uStack_f0 = puVar10[3];
        local_108 = &uStack_f8;
      }
      else {
        uStack_f8 = *puVar14;
        local_108 = (ulong *)*puVar10;
      }
      lStack_100 = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)puVar14 = 0;
      std::__cxx11::string::operator=
                ((string *)(ks_abi_cxx11_[local_e8] + local_98),(string *)&local_108);
      if (local_108 != &uStack_f8) {
        operator_delete(local_108);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_128._M_id._M_thread != (id)&local_118) {
        operator_delete((void *)local_128._M_id._M_thread);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_e0._M_id._M_thread != (id)&local_d0) {
        operator_delete((void *)local_e0._M_id._M_thread);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      lVar19 = 0;
      do {
        if (*(char *)((long)in_FS_OFFSET + -4) == '\0') {
          *(undefined1 *)((long)in_FS_OFFSET + -4) = 1;
          uVar5 = rdtsc();
          *(int *)(in_FS_OFFSET + -1) = (int)uVar5;
        }
        iVar9 = rand_r((uint *)(lVar17 + -8));
        v[lVar19] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                    [(ulong)(long)iVar9 % 0x3e];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x403);
      v[0x403] = '\0';
      pcVar3 = (char *)vs_abi_cxx11_[lVar16][uVar13]._M_string_length;
      strlen(v);
      std::__cxx11::string::_M_replace((ulong)(vs_abi_cxx11_[lVar16] + uVar13),0,pcVar3,0x109570);
      uVar13 = local_98 + 1;
    } while (uVar13 != 1000);
    lVar16 = local_e8 + 1;
  } while (lVar16 != 4);
  local_108 = (ulong *)0x0;
  lStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  local_e0._M_id._M_thread = (id)((ulong)local_e0._M_id._M_thread & 0xffffffff00000000);
  do {
    std::thread::thread<void(&)(int),int&,void>(&local_128,test_thread,(int *)&local_e0);
    iVar9 = (int)local_e0._M_id._M_thread;
    if ((&local_108)[(int)local_e0._M_id._M_thread] != (ulong *)0x0) goto LAB_00104396;
    ((id *)(&local_108 + (int)local_e0._M_id._M_thread))->_M_thread =
         (native_handle_type)local_128._M_id._M_thread;
    local_e0._M_id._M_thread._0_4_ = iVar9 + 1;
  } while (iVar9 < 3);
  lVar17 = 0;
  do {
    std::thread::join();
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x20);
  local_128._M_id._M_thread = (id)&local_118;
  local_120 = 0;
  local_118 = local_118 & 0xffffffffffffff00;
  lVar19 = 0x10b8b8;
  lVar17 = 0x12acb8;
  lVar16 = 0;
  do {
    lVar18 = 0;
    do {
      local_e0._M_id._M_thread = *(id *)(lVar19 + -8 + lVar18);
      sStack_d8 = *(size_type *)(lVar19 + lVar18);
      iVar9 = (*engine->_vptr_Engine[3])(engine,&local_e0,&local_128);
      if (iVar9 != 0) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                      ,0x51,"int main()");
      }
      if (local_120 != *(size_t *)(lVar17 + lVar18)) {
LAB_00104276:
        __assert_fail("value == vs[t][i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                      ,0x52,"int main()");
      }
      if (local_120 != 0) {
        iVar9 = bcmp((void *)local_128._M_id._M_thread,*(void **)(lVar17 + -8 + lVar18),local_120);
        if (iVar9 != 0) goto LAB_00104276;
      }
      lVar18 = lVar18 + 0x20;
    } while (lVar18 != 32000);
    lVar16 = lVar16 + 1;
    lVar19 = lVar19 + 32000;
    lVar17 = lVar17 + 32000;
  } while (lVar16 != 4);
  local_50[0] = (char *)((ulong)local_50[0] & 0xffffffff00000000);
  do {
    std::thread::thread<void(&)(int),int&,void>(&local_e0,test_thread_conflict,(int *)local_50);
    iVar9 = (int)local_50[0];
    if ((&local_108)[(int)local_50[0]] != (ulong *)0x0) goto LAB_00104396;
    ((id *)(&local_108 + (int)local_50[0]))->_M_thread =
         (native_handle_type)local_e0._M_id._M_thread;
    local_50[0] = (char *)CONCAT44(local_50[0]._4_4_,iVar9 + 1);
  } while (iVar9 < 3);
  lVar17 = 0;
  do {
    std::thread::join();
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x20);
  lVar17 = 0;
LAB_00104134:
  local_e0._M_id._M_thread = (id)ks_abi_cxx11_[0][lVar17]._M_dataplus._M_p;
  sStack_d8 = ks_abi_cxx11_[0][lVar17]._M_string_length;
  iVar9 = (*engine->_vptr_Engine[3])(engine,&local_e0,&local_128);
  sVar12 = local_120;
  __s1._M_id._M_thread = local_128._M_id._M_thread;
  if (iVar9 != 0) {
    __assert_fail("ret == kSucc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                  ,0x5f,"int main()");
  }
  lVar16 = 8;
  do {
    if (sVar12 == *(size_t *)
                   ((long)&(((string *)&local_a0->_M_dataplus)->_M_dataplus)._M_p + lVar16)) {
      if (sVar12 == 0) break;
      iVar9 = bcmp((void *)__s1._M_id._M_thread,*(void **)((long)local_a0 + lVar16 + -8),sVar12);
      if (iVar9 == 0) break;
    }
    lVar16 = lVar16 + 32000;
    if (lVar16 == 0x1f408) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                    ,0x68,"int main()");
    }
  } while( true );
  lVar17 = lVar17 + 1;
  local_a0 = local_a0 + 1;
  if (lVar17 == 0x32) {
    if (engine != (Engine *)0x0) {
      (*engine->_vptr_Engine[1])();
    }
    local_e0._M_id._M_thread = (id)(id)&local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "======================= multi thread test pass :) ======================","");
    printf("\x1b[1;32;40m%s\x1b[0m\n",local_e0._M_id._M_thread);
    if (local_e0._M_id._M_thread != (id)&local_d0) {
      operator_delete((void *)local_e0._M_id._M_thread);
    }
    if (local_128._M_id._M_thread != (id)&local_118) {
      operator_delete((void *)local_128._M_id._M_thread);
    }
    lVar17 = 0x20;
    while (*(long *)((long)&nStack_110 + lVar17) == 0) {
      lVar17 = lVar17 + -8;
      if (lVar17 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        return 0;
      }
    }
LAB_00104396:
    std::terminate();
  }
  goto LAB_00104134;
}

Assistant:

int main() {

    printf_(
        "======================= multi thread test "
        "============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    RetCode ret = Engine::Open(engine_path, &engine);
    assert(ret == kSucc);
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            gen_random(k, 6);
            ks[t][i] = std::to_string(t) + "th" + std::string(k) + std::to_string(i);

            gen_random(v, 1027);
            vs[t][i] = v;
        }
    }

    std::thread ths[THREAD_NUM];
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }

    std::string value;
    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            ret = engine->Read(ks[t][i], &value);
            assert(ret == kSucc);
            assert(value == vs[t][i]);
        }
    }

    ////////////////////////////////////////////////////////////////////
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread_conflict, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }
    for (int i = 0; i < CONFLICT_KEY; ++i) {
        ret = engine->Read(ks[0][i], &value);
        assert(ret == kSucc);

        bool found = false;
        for (int t = 0; t < THREAD_NUM; ++t) {
            if (value == vs[t][i]) {
                found = true;
                break;
            }
        }
        assert(found);
    }

    delete engine;


    printf_(
        "======================= multi thread test pass :) "
        "======================");

    return 0;
}